

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# main.cpp
# Opt level: O2

void __thiscall TestComplexityCoverage::TestComplexityCoverage(TestComplexityCoverage *this)

{
  allocator local_4a;
  allocator local_49;
  string local_48;
  string local_28;
  
  std::__cxx11::string::string((string *)&local_28,"ComplexityCoverage",&local_49);
  std::__cxx11::string::string((string *)&local_48,"Test",&local_4a);
  testinator::Test::Test(&this->super_Test,&local_28,&local_48);
  std::__cxx11::string::~string((string *)&local_48);
  std::__cxx11::string::~string((string *)&local_28);
  (this->super_Test)._vptr_Test = (_func_int **)&PTR__Test_001775c0;
  return;
}

Assistant:

DEF_TEST(ComplexityCoverage, Test)
{
  testinator::TestRegistry r;
  ostringstream oss;
  std::unique_ptr<testinator::Outputter> op =
    make_unique<testinator::DefaultOutputter>(oss);

  TestComplexityCoverageInternal myTestA(r, "A");
  testinator::Results rs = r.RunAllTests(testinator::RunParams(), op.get());

  static string expected = "O(1)";
  return oss.str().find(expected) != string::npos;
}